

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereOrInsert(WhereOrSet *pSet,Bitmask prereq,LogEst rRun,LogEst nOut)

{
  ushort uVar1;
  WhereOrCost *local_30;
  WhereOrCost *p;
  u16 i;
  LogEst nOut_local;
  LogEst rRun_local;
  Bitmask prereq_local;
  WhereOrSet *pSet_local;
  
  local_30 = pSet->a;
  for (p._2_2_ = pSet->n; p._2_2_ != 0; p._2_2_ = p._2_2_ - 1) {
    if ((rRun <= local_30->rRun) && ((prereq & local_30->prereq) == prereq)) goto LAB_00254aeb;
    if ((local_30->rRun <= rRun) && ((local_30->prereq & prereq) == local_30->prereq)) {
      return 0;
    }
    local_30 = local_30 + 1;
  }
  if (pSet->n < 3) {
    uVar1 = pSet->n;
    pSet->n = uVar1 + 1;
    local_30 = pSet->a + uVar1;
    local_30->nOut = nOut;
  }
  else {
    local_30 = pSet->a;
    for (p._2_2_ = 1; p._2_2_ < pSet->n; p._2_2_ = p._2_2_ + 1) {
      if (pSet->a[p._2_2_].rRun < local_30->rRun) {
        local_30 = pSet->a + (int)(uint)p._2_2_;
      }
    }
    if (local_30->rRun <= rRun) {
      return 0;
    }
  }
LAB_00254aeb:
  local_30->prereq = prereq;
  local_30->rRun = rRun;
  if (nOut < local_30->nOut) {
    local_30->nOut = nOut;
  }
  return 1;
}

Assistant:

static int whereOrInsert(
  WhereOrSet *pSet,      /* The WhereOrSet to be updated */
  Bitmask prereq,        /* Prerequisites of the new entry */
  LogEst rRun,           /* Run-cost of the new entry */
  LogEst nOut            /* Number of outputs for the new entry */
){
  u16 i;
  WhereOrCost *p;
  for(i=pSet->n, p=pSet->a; i>0; i--, p++){
    if( rRun<=p->rRun && (prereq & p->prereq)==prereq ){
      goto whereOrInsert_done;
    }
    if( p->rRun<=rRun && (p->prereq & prereq)==p->prereq ){
      return 0;
    }
  }
  if( pSet->n<N_OR_COST ){
    p = &pSet->a[pSet->n++];
    p->nOut = nOut;
  }else{
    p = pSet->a;
    for(i=1; i<pSet->n; i++){
      if( p->rRun>pSet->a[i].rRun ) p = pSet->a + i;
    }
    if( p->rRun<=rRun ) return 0;
  }
whereOrInsert_done:
  p->prereq = prereq;
  p->rRun = rRun;
  if( p->nOut>nOut ) p->nOut = nOut;
  return 1;
}